

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O3

Constant * __thiscall
spvtools::opt::analysis::ConstantManager::GetDoubleConst(ConstantManager *this,double val)

{
  IRContext *this_00;
  Type *type;
  Constant *pCVar1;
  FloatProxy<double> v;
  FloatProxy<double> local_50;
  Type local_48;
  
  this_00 = this->ctx_;
  if ((this_00->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(this_00);
  }
  local_48.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.kind_ = kFloat;
  local_48._36_4_ = 0x40;
  local_48._vptr_Type = (_func_int **)&PTR__Type_003dbaf0;
  type = TypeManager::GetRegisteredType
                   ((this_00->type_mgr_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                    .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                    _M_head_impl,&local_48);
  local_48._vptr_Type = (_func_int **)&PTR__Type_003d7f68;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_48.decorations_);
  local_50.data_ = (uint_type)val;
  utils::FloatProxy<double>::GetWords
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&local_50);
  pCVar1 = GetConstant(this,type,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
  if (local_48._vptr_Type != (_func_int **)0x0) {
    operator_delete(local_48._vptr_Type,
                    (long)local_48.decorations_.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)local_48._vptr_Type);
  }
  return pCVar1;
}

Assistant:

const Constant* ConstantManager::GetDoubleConst(double val) {
  Type* float_type = context()->get_type_mgr()->GetDoubleType();
  utils::FloatProxy<double> v(val);
  const Constant* c = GetConstant(float_type, v.GetWords());
  return c;
}